

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void Cmd_quickload(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  char *pcVar2;
  DMenu *menu;
  DMenu *newmenu;
  FName local_20;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  if (netgame) {
    M_StartControlPanel(true);
    pcVar2 = FStringTable::operator()(&GStrings,"QLOADNET");
    FName::FName(&local_20,NAME_None);
    M_StartMessage(pcVar2,1,&local_20);
  }
  else if (quickSaveSlot == (FSaveGameNode *)0x0) {
    M_StartControlPanel(true);
    quickSaveSlot = (FSaveGameNode *)0x1;
    FName::FName((FName *)((long)&newmenu + 4),NAME_Loadgamemenu);
    M_SetMenu((FName *)((long)&newmenu + 4),-1);
  }
  else {
    bVar1 = FBoolCVar::operator_cast_to_bool(&saveloadconfirmation);
    if (bVar1) {
      M_StartControlPanel(true);
      menu = (DMenu *)DObject::operator_new((DObject *)0x50,(size_t)who);
      DQuickLoadMenu::DQuickLoadMenu((DQuickLoadMenu *)menu,false);
      TObjPtr<DMenu>::operator=(&menu->mParentMenu,DMenu::CurrentMenu);
      M_ActivateMenu(menu);
    }
    else {
      pcVar2 = FString::GetChars(&quickSaveSlot->Filename);
      G_LoadGame(pcVar2,false);
    }
  }
  return;
}

Assistant:

CCMD (quickload)
{	// F9
	if (netgame)
	{
		M_StartControlPanel(true);
		M_StartMessage (GStrings("QLOADNET"), 1);
		return;
	}
		
	if (quickSaveSlot == NULL)
	{
		M_StartControlPanel(true);
		// signal that whatever gets loaded should be the new quicksave
		quickSaveSlot = (FSaveGameNode *)1;
		M_SetMenu(NAME_Loadgamemenu);
		return;
	}

	// [mxd]. Just load the game, no questions asked.
	if (!saveloadconfirmation)
	{
		G_LoadGame(quickSaveSlot->Filename.GetChars());
		return;
	}

	M_StartControlPanel(true);
	DMenu *newmenu = new DQuickLoadMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}